

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::erase
          (Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *this,size_t bucket)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  long in_RSI;
  long in_RDI;
  uchar entry;
  
  bVar1 = *(byte *)(in_RDI + in_RSI);
  *(undefined1 *)(in_RDI + in_RSI) = 0xff;
  Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 0x10));
  uVar2 = *(uchar *)(in_RDI + 0x89);
  puVar3 = Entry::nextFree((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)bVar1 * 0x10));
  *puVar3 = uVar2;
  *(byte *)(in_RDI + 0x89) = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }